

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_diag_avx2_256_32.c
# Opt level: O2

parasail_result_t *
parasail_sw_table_diag_avx2_256_32
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int32_t iVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  int iVar14;
  parasail_result_t *ppVar15;
  int32_t *ptr;
  int32_t *ptr_00;
  int32_t *ptr_01;
  uint uVar16;
  uint uVar17;
  char *pcVar18;
  uint uVar19;
  uint uVar20;
  long lVar21;
  ulong uVar22;
  int iVar23;
  ulong uVar24;
  char *__format;
  uint uVar25;
  int iVar26;
  ulong uVar27;
  uint uVar28;
  int iVar29;
  uint uVar30;
  uint uVar31;
  ulong uVar32;
  uint uVar33;
  ulong uVar34;
  long lVar35;
  int iVar36;
  undefined1 auVar37 [32];
  undefined1 auVar38 [64];
  undefined1 auVar39 [32];
  undefined1 auVar40 [64];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 in_ZMM8 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [32];
  undefined1 auVar45 [64];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [64];
  undefined1 auVar49 [32];
  undefined1 auVar50 [64];
  int32_t *local_2f8;
  ulong local_2c0;
  ulong local_2b8;
  ulong local_2b0;
  ulong local_2a8;
  ulong local_2a0;
  long local_298;
  long local_290;
  undefined1 local_280 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  int local_120;
  int iStack_11c;
  int iStack_118;
  int iStack_114;
  int iStack_110;
  int iStack_10c;
  int iStack_108;
  int iStack_104;
  uint local_100;
  uint uStack_fc;
  uint uStack_f8;
  uint uStack_f4;
  uint uStack_f0;
  uint uStack_ec;
  uint uStack_e8;
  uint uStack_e4;
  undefined1 local_e0 [32];
  int local_c0;
  int iStack_bc;
  int iStack_b8;
  int iStack_b4;
  int iStack_b0;
  int iStack_ac;
  int iStack_a8;
  int iStack_a4;
  int local_a0;
  int iStack_9c;
  int iStack_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  int iStack_88;
  int iStack_84;
  int local_80;
  int iStack_7c;
  int iStack_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  int iStack_68;
  int iStack_64;
  
  if (_s2 == (char *)0x0) {
    __format = "%s: missing %s\n";
    pcVar18 = "_s2";
  }
  else {
    uVar34 = (ulong)(uint)s2Len;
    if (s2Len < 1) {
      __format = "%s: %s must be > 0\n";
      pcVar18 = "s2Len";
    }
    else if (open < 0) {
      __format = "%s: %s must be >= 0\n";
      pcVar18 = "open";
    }
    else if (gap < 0) {
      __format = "%s: %s must be >= 0\n";
      pcVar18 = "gap";
    }
    else if (matrix == (parasail_matrix_t *)0x0) {
      __format = "%s: missing %s\n";
      pcVar18 = "matrix";
    }
    else {
      if (matrix->type != 0) {
        _s1Len = matrix->length;
LAB_0075830c:
        iVar23 = matrix->min;
        uVar16 = 0x80000000 - iVar23;
        if (iVar23 != -open && SBORROW4(iVar23,-open) == iVar23 + open < 0) {
          uVar16 = open | 0x80000000;
        }
        iVar36 = uVar16 + 1;
        iVar23 = 0x7ffffffe - matrix->max;
        local_140._4_4_ = iVar36;
        local_140._0_4_ = iVar36;
        local_140._8_4_ = iVar36;
        local_140._12_4_ = iVar36;
        local_140._16_4_ = iVar36;
        local_140._20_4_ = iVar36;
        local_140._24_4_ = iVar36;
        local_140._28_4_ = iVar36;
        local_1c0._4_4_ = iVar36;
        local_1c0._0_4_ = iVar36;
        local_1c0._8_4_ = iVar36;
        local_1c0._12_4_ = iVar36;
        local_1c0._16_4_ = iVar36;
        local_1c0._20_4_ = iVar36;
        local_1c0._24_4_ = iVar36;
        local_1c0._28_4_ = iVar36;
        auVar42 = ZEXT1632(in_ZMM8._0_16_);
        ppVar15 = parasail_result_new_table1(_s1Len,s2Len);
        if (ppVar15 != (parasail_result_t *)0x0) {
          ppVar15->flag = ppVar15->flag | 0x8421004;
          uVar24 = (ulong)(s2Len + 0xe);
          ptr = parasail_memalign_int32_t(0x20,uVar24);
          ptr_00 = parasail_memalign_int32_t(0x20,uVar24);
          ptr_01 = parasail_memalign_int32_t(0x20,uVar24);
          if (ptr_01 != (int32_t *)0x0 && (ptr_00 != (int32_t *)0x0 && ptr != (int32_t *)0x0)) {
            lVar35 = (long)_s1Len;
            if (matrix->type == 0) {
              local_2f8 = parasail_memalign_int32_t(0x20,(long)(int)(_s1Len + 7));
              if (local_2f8 == (int32_t *)0x0) {
                return (parasail_result_t *)0x0;
              }
              for (uVar24 = 0; lVar21 = lVar35, (uint)(~(_s1Len >> 0x1f) & _s1Len) != uVar24;
                  uVar24 = uVar24 + 1) {
                local_2f8[uVar24] = matrix->mapper[(byte)_s1[uVar24]];
              }
              for (; lVar21 < (int)(_s1Len + 7); lVar21 = lVar21 + 1) {
                local_2f8[lVar21] = 0;
              }
            }
            else {
              local_2f8 = (int32_t *)0x0;
            }
            uVar16 = s2Len + 7;
            local_120 = iVar23;
            iStack_11c = iVar23;
            iStack_118 = iVar23;
            iStack_114 = iVar23;
            iStack_110 = iVar23;
            iStack_10c = iVar23;
            iStack_108 = iVar23;
            iStack_104 = iVar23;
            auVar11._4_4_ = iVar36;
            auVar11._0_4_ = iVar36;
            auVar11._8_4_ = iVar36;
            auVar11._12_4_ = iVar36;
            auVar11._16_4_ = iVar36;
            auVar11._20_4_ = iVar36;
            auVar11._24_4_ = iVar36;
            auVar11._28_4_ = iVar36;
            local_e0 = vpblendd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar11,0x7f);
            local_80 = open;
            iStack_7c = open;
            iStack_78 = open;
            iStack_74 = open;
            iStack_70 = open;
            iStack_6c = open;
            iStack_68 = open;
            iStack_64 = open;
            local_a0 = gap;
            iStack_9c = gap;
            iStack_98 = gap;
            iStack_94 = gap;
            iStack_90 = gap;
            iStack_8c = gap;
            iStack_88 = gap;
            iStack_84 = gap;
            local_100 = _s1Len;
            uStack_fc = _s1Len;
            uStack_f8 = _s1Len;
            uStack_f4 = _s1Len;
            uStack_f0 = _s1Len;
            uStack_ec = _s1Len;
            uStack_e8 = _s1Len;
            uStack_e4 = _s1Len;
            local_c0 = s2Len;
            iStack_bc = s2Len;
            iStack_b8 = s2Len;
            iStack_b4 = s2Len;
            iStack_b0 = s2Len;
            iStack_ac = s2Len;
            iStack_a8 = s2Len;
            iStack_a4 = s2Len;
            piVar3 = matrix->mapper;
            for (uVar24 = 0; uVar34 != uVar24; uVar24 = uVar24 + 1) {
              ptr[uVar24 + 7] = piVar3[(byte)_s2[uVar24]];
            }
            for (lVar21 = 0; uVar24 = uVar34, lVar21 != 7; lVar21 = lVar21 + 1) {
              ptr[lVar21] = 0;
            }
            for (; (int)uVar24 < (int)uVar16; uVar24 = uVar24 + 1) {
              ptr[uVar24 + 7] = 0;
            }
            for (uVar24 = 0; uVar34 != uVar24; uVar24 = uVar24 + 1) {
              ptr_00[uVar24 + 7] = 0;
              ptr_01[uVar24 + 7] = iVar36;
            }
            for (lVar21 = 0; uVar24 = uVar34, lVar21 != 7; lVar21 = lVar21 + 1) {
              ptr_00[lVar21] = iVar36;
              ptr_01[lVar21] = iVar36;
            }
            for (; (int)uVar24 < (int)uVar16; uVar24 = uVar24 + 1) {
              ptr_00[uVar24 + 7] = iVar36;
              ptr_01[uVar24 + 7] = iVar36;
            }
            uVar19 = _s1Len - 1;
            auVar38 = ZEXT3264(local_140);
            auVar48 = ZEXT3264(local_1c0);
            lVar21 = uVar34 * 4;
            local_298 = uVar34 * 0xc + -0xc;
            local_280._8_8_ = 0x400000005;
            local_280._0_8_ = 0x600000007;
            local_280._16_8_ = 0x200000003;
            local_280._24_8_ = 1;
            local_290 = 0;
            auVar42 = vpcmpeqd_avx2(auVar42,auVar42);
            auVar43 = ZEXT3264(auVar42);
            local_180._4_4_ = iVar36;
            local_180._0_4_ = iVar36;
            local_180._8_4_ = iVar36;
            local_180._12_4_ = iVar36;
            local_180._16_4_ = iVar36;
            local_180._20_4_ = iVar36;
            local_180._24_4_ = iVar36;
            local_180._28_4_ = iVar36;
            auVar40 = ZEXT3264(local_180);
            auVar50 = ZEXT3264(local_180);
            auVar45 = ZEXT3264(local_180);
            local_1a0._4_4_ = iVar23;
            local_1a0._0_4_ = iVar23;
            local_1a0._12_4_ = iVar23;
            local_1a0._8_4_ = iVar23;
            local_1a0._20_4_ = iVar23;
            local_1a0._16_4_ = iVar23;
            local_1a0._28_4_ = iVar23;
            local_1a0._24_4_ = iVar23;
            for (uVar24 = 0; (long)uVar24 < lVar35; uVar24 = uVar24 + 8) {
              uVar27 = uVar24 | 3;
              if (matrix->type == 0) {
                uVar31 = local_2f8[uVar24 + 1];
                uVar33 = local_2f8[uVar24 + 2];
                uVar17 = local_2f8[uVar27];
                uVar25 = local_2f8[uVar24 + 4];
                uVar28 = local_2f8[uVar24 + 5];
                uVar30 = local_2f8[uVar24 + 6];
                uVar32 = (ulong)(uint)local_2f8[uVar24];
                uVar20 = local_2f8[uVar24 + 7];
              }
              else {
                uVar20 = (uint)uVar24;
                uVar31 = uVar19;
                if ((long)(uVar24 | 1) < lVar35) {
                  uVar31 = uVar20 | 1;
                }
                uVar33 = uVar20 | 2;
                if (lVar35 <= (long)(uVar24 | 2)) {
                  uVar33 = uVar19;
                }
                uVar17 = uVar20 | 3;
                if (lVar35 <= (long)uVar27) {
                  uVar17 = uVar19;
                }
                uVar25 = uVar20 | 4;
                if (lVar35 <= (long)(uVar24 | 4)) {
                  uVar25 = uVar19;
                }
                uVar28 = uVar20 | 5;
                if (lVar35 <= (long)(uVar24 | 5)) {
                  uVar28 = uVar19;
                }
                uVar30 = uVar20 | 6;
                if (lVar35 <= (long)(uVar24 | 6)) {
                  uVar30 = uVar19;
                }
                uVar32 = uVar24;
                uVar20 = uVar20 | 7;
                if (lVar35 <= (long)(uVar24 | 7)) {
                  uVar20 = uVar19;
                }
              }
              local_2a0 = uVar24 | 1;
              local_2a8 = uVar24 | 6;
              local_2b0 = uVar24 | 2;
              local_2b8 = uVar24 | 4;
              local_2c0 = uVar24 | 5;
              piVar3 = matrix->matrix;
              iVar29 = matrix->size;
              auVar42._4_4_ = _s1Len;
              auVar42._0_4_ = _s1Len;
              auVar42._8_4_ = _s1Len;
              auVar42._12_4_ = _s1Len;
              auVar42._16_4_ = _s1Len;
              auVar42._20_4_ = _s1Len;
              auVar42._24_4_ = _s1Len;
              auVar42._28_4_ = _s1Len;
              auVar39 = vpcmpgtd_avx2(auVar42,local_280);
              auVar8._4_4_ = iVar36;
              auVar8._0_4_ = iVar36;
              auVar8._8_4_ = iVar36;
              auVar8._12_4_ = iVar36;
              auVar8._16_4_ = iVar36;
              auVar8._20_4_ = iVar36;
              auVar8._24_4_ = iVar36;
              auVar8._28_4_ = iVar36;
              auVar10 = vpmovsxbd_avx2(ZEXT816(0xfffefdfcfbfaf9));
              auVar41 = local_e0;
              auVar42 = auVar8;
              auVar11 = local_e0;
              for (uVar22 = 0; (~((int)uVar16 >> 0x1f) & uVar16) != uVar22; uVar22 = uVar22 + 1) {
                auVar6 = vpinsrd_avx(ZEXT416((uint)piVar3[(long)(int)(uVar17 * iVar29) +
                                                          (long)ptr[uVar22 + 4]]),
                                     piVar3[(long)(int)(uVar33 * iVar29) + (long)ptr[uVar22 + 5]],1)
                ;
                auVar6 = vpinsrd_avx(auVar6,piVar3[(long)(int)(uVar31 * iVar29) +
                                                   (long)ptr[uVar22 + 6]],2);
                auVar6 = vpinsrd_avx(auVar6,piVar3[(long)((int)uVar32 * iVar29) +
                                                   (long)ptr[uVar22 + 7]],3);
                auVar7 = vpinsrd_avx(ZEXT416((uint)piVar3[(long)(int)(uVar20 * iVar29) +
                                                          (long)ptr[uVar22]]),
                                     piVar3[(long)(int)(uVar30 * iVar29) + (long)ptr[uVar22 + 1]],1)
                ;
                auVar7 = vpinsrd_avx(auVar7,piVar3[(long)(int)(uVar28 * iVar29) +
                                                   (long)ptr[uVar22 + 2]],2);
                auVar7 = vpinsrd_avx(auVar7,piVar3[(long)(int)(uVar25 * iVar29) +
                                                   (long)ptr[uVar22 + 3]],3);
                auVar47 = vpmovsxbd_avx2(ZEXT816(0x7060504030201));
                auVar12 = vpermd_avx2(auVar47,auVar11);
                iVar1 = ptr_00[uVar22 + 7];
                auVar46._4_4_ = iVar1;
                auVar46._0_4_ = iVar1;
                auVar46._8_4_ = iVar1;
                auVar46._12_4_ = iVar1;
                auVar46._16_4_ = iVar1;
                auVar46._20_4_ = iVar1;
                auVar46._24_4_ = iVar1;
                auVar46._28_4_ = iVar1;
                auVar46 = vpblendd_avx2(auVar12,auVar46,0x80);
                auVar42 = vpermd_avx2(auVar47,auVar42);
                iVar1 = ptr_01[uVar22 + 7];
                auVar47._4_4_ = iVar1;
                auVar47._0_4_ = iVar1;
                auVar47._8_4_ = iVar1;
                auVar47._12_4_ = iVar1;
                auVar47._16_4_ = iVar1;
                auVar47._20_4_ = iVar1;
                auVar47._24_4_ = iVar1;
                auVar47._28_4_ = iVar1;
                auVar47 = vpblendd_avx2(auVar42,auVar47,0x80);
                auVar44._4_4_ = open;
                auVar44._0_4_ = open;
                auVar44._8_4_ = open;
                auVar44._12_4_ = open;
                auVar44._16_4_ = open;
                auVar44._20_4_ = open;
                auVar44._24_4_ = open;
                auVar44._28_4_ = open;
                auVar42 = vpsubd_avx2(auVar46,auVar44);
                auVar12._4_4_ = gap;
                auVar12._0_4_ = gap;
                auVar12._8_4_ = gap;
                auVar12._12_4_ = gap;
                auVar12._16_4_ = gap;
                auVar12._20_4_ = gap;
                auVar12._24_4_ = gap;
                auVar12._28_4_ = gap;
                auVar47 = vpsubd_avx2(auVar47,auVar12);
                auVar47 = vpmaxsd_avx2(auVar42,auVar47);
                auVar42 = vpsubd_avx2(auVar11,auVar44);
                auVar11 = vpsubd_avx2(auVar8,auVar12);
                auVar12 = vpmaxsd_avx2(auVar42,auVar11);
                auVar37._0_16_ = ZEXT116(0) * auVar6 + ZEXT116(1) * auVar7;
                auVar37._16_16_ = ZEXT116(1) * auVar6;
                auVar42 = vpaddd_avx2(auVar37,auVar41);
                auVar11 = vpmaxsd_avx2(auVar12,auVar47);
                auVar11 = vpmaxsd_avx2(auVar11,_DAT_008a5840);
                auVar41 = vpmaxsd_avx2(auVar42,auVar11);
                auVar8 = vpcmpeqd_avx2(auVar43._0_32_,auVar10);
                auVar11 = vpandn_avx2(auVar8,auVar41);
                if (7 < uVar22) {
                  local_1a0 = vpminsd_avx2(local_1a0,auVar11);
                  local_180 = vpmaxsd_avx2(local_180,auVar11);
                }
                piVar4 = ((ppVar15->field_4).rowcols)->score_row;
                if (uVar22 < uVar34) {
                  *(int *)((long)piVar4 + uVar22 * 4 + local_290) = auVar11._28_4_;
                }
                if (uVar22 - 1 < uVar34 && (long)local_2a0 < lVar35) {
                  *(int *)((long)piVar4 + uVar22 * 4 + lVar21 * local_2a0 + -4) = auVar11._24_4_;
                }
                if (((long)local_2b0 < lVar35) && ((long)(uVar22 - 2) < (long)uVar34 && 1 < uVar22))
                {
                  *(int *)((long)piVar4 + uVar22 * 4 + lVar21 * local_2b0 + -8) = auVar11._20_4_;
                }
                if (((long)uVar27 < lVar35) && ((long)(uVar22 - 3) < (long)uVar34 && 2 < uVar22)) {
                  *(int *)((long)piVar4 + uVar22 * 4 + local_298) = auVar11._16_4_;
                }
                if (((long)local_2b8 < lVar35) && ((long)(uVar22 - 4) < (long)uVar34 && 3 < uVar22))
                {
                  *(int *)((long)piVar4 + uVar22 * 4 + lVar21 * local_2b8 + -0x10) = auVar11._12_4_;
                }
                if (((long)local_2c0 < lVar35) && ((long)(uVar22 - 5) < (long)uVar34 && 4 < uVar22))
                {
                  *(int *)((long)piVar4 + uVar22 * 4 + lVar21 * local_2c0 + -0x14) = auVar11._8_4_;
                }
                if (((long)local_2a8 < lVar35) && ((long)(uVar22 - 6) < (long)uVar34 && 5 < uVar22))
                {
                  *(int *)((long)piVar4 + uVar22 * 4 + lVar21 * local_2a8 + -0x18) = auVar11._4_4_;
                }
                auVar9._4_4_ = iVar36;
                auVar9._0_4_ = iVar36;
                auVar9._8_4_ = iVar36;
                auVar9._12_4_ = iVar36;
                auVar9._16_4_ = iVar36;
                auVar9._20_4_ = iVar36;
                auVar9._24_4_ = iVar36;
                auVar9._28_4_ = iVar36;
                auVar42 = vblendvps_avx(auVar47,auVar9,auVar8);
                if (6 < uVar22 && (long)(uVar24 | 7) < lVar35) {
                  *(int32_t *)((long)piVar4 + uVar22 * 4 + lVar21 * (uVar24 | 7) + -0x1c) =
                       auVar11._0_4_;
                }
                auVar13._4_4_ = s2Len;
                auVar13._0_4_ = s2Len;
                auVar13._8_4_ = s2Len;
                auVar13._12_4_ = s2Len;
                auVar13._16_4_ = s2Len;
                auVar13._20_4_ = s2Len;
                auVar13._24_4_ = s2Len;
                auVar13._28_4_ = s2Len;
                auVar47 = vpcmpgtd_avx2(auVar13,auVar10);
                auVar47 = vpand_avx2(auVar39,auVar47);
                auVar44 = vpsrad_avx2(auVar10,0x1f);
                auVar37 = vpandn_avx2(auVar44,auVar47);
                auVar6 = vpackssdw_avx(auVar37._0_16_,auVar37._16_16_);
                auVar49 = auVar50._0_32_;
                auVar44 = vpcmpeqd_avx2(auVar11,auVar49);
                auVar9 = vpcmpgtd_avx2(auVar11,auVar49);
                auVar47 = vpand_avx2(auVar9,auVar37);
                auVar41 = vblendvps_avx(auVar49,auVar41,auVar47);
                auVar38 = ZEXT3264(auVar41);
                auVar7 = vpackssdw_avx(auVar47._0_16_,auVar47._16_16_);
                auVar47 = vpcmpgtd_avx2(auVar40._0_32_,auVar10);
                auVar44 = vpand_avx2(auVar44,auVar47);
                auVar5 = vpackssdw_avx(auVar44._0_16_,auVar44._16_16_);
                auVar6 = vpblendvb_avx(auVar7,auVar6,auVar5);
                auVar49._4_4_ = iVar36;
                auVar49._0_4_ = iVar36;
                auVar49._8_4_ = iVar36;
                auVar49._12_4_ = iVar36;
                auVar49._16_4_ = iVar36;
                auVar49._20_4_ = iVar36;
                auVar49._24_4_ = iVar36;
                auVar49._28_4_ = iVar36;
                auVar8 = vblendvps_avx(auVar12,auVar49,auVar8);
                auVar47 = vpmovsxwd_avx2(auVar6);
                auVar47 = vblendvps_avx(auVar45._0_32_,local_280,auVar47);
                auVar45 = ZEXT3264(auVar47);
                auVar47 = vpor_avx2(auVar44,auVar9);
                ptr_00[uVar22] = auVar11._0_4_;
                ptr_01[uVar22] = auVar42._0_4_;
                auVar47 = vpand_avx2(auVar37,auVar47);
                auVar47 = vblendvps_avx(auVar40._0_32_,auVar10,auVar47);
                auVar48 = ZEXT3264(auVar47);
                auVar12 = vpcmpeqd_avx2(auVar44,auVar44);
                auVar43 = ZEXT3264(auVar12);
                auVar10 = vpsubd_avx2(auVar10,auVar12);
                auVar40 = ZEXT3264(auVar47);
                auVar50 = ZEXT3264(auVar41);
                auVar41 = auVar46;
              }
              auVar39._8_4_ = 8;
              auVar39._0_8_ = 0x800000008;
              auVar39._12_4_ = 8;
              auVar39._16_4_ = 8;
              auVar39._20_4_ = 8;
              auVar39._24_4_ = 8;
              auVar39._28_4_ = 8;
              local_280 = vpaddd_avx2(local_280,auVar39);
              local_298 = local_298 + uVar34 * 0x20;
              local_290 = local_290 + uVar34 * 0x20;
            }
            local_140 = auVar38._0_32_;
            local_1c0 = auVar48._0_32_;
            local_160 = auVar45._0_32_;
            iVar26 = 0;
            iVar14 = 0;
            iVar29 = iVar36;
            for (lVar35 = 0; (int)lVar35 != 8; lVar35 = lVar35 + 1) {
              iVar2 = *(int *)(local_140 + lVar35 * 4);
              if (iVar29 < iVar2) {
                iVar29 = iVar2;
                iVar14 = *(int *)(local_160 + lVar35 * 4);
                iVar26 = *(int *)(local_1c0 + lVar35 * 4);
              }
              else if (iVar2 == iVar29) {
                iVar2 = *(int *)(local_1c0 + lVar35 * 4);
                if (iVar2 < iVar26) {
                  iVar14 = *(int *)(local_160 + lVar35 * 4);
                  iVar26 = iVar2;
                }
                else if ((iVar2 == iVar26) && (*(int *)(local_160 + lVar35 * 4) < iVar14)) {
                  iVar14 = *(int *)(local_160 + lVar35 * 4);
                }
              }
            }
            auVar10._4_4_ = iVar36;
            auVar10._0_4_ = iVar36;
            auVar10._8_4_ = iVar36;
            auVar10._12_4_ = iVar36;
            auVar10._16_4_ = iVar36;
            auVar10._20_4_ = iVar36;
            auVar10._24_4_ = iVar36;
            auVar10._28_4_ = iVar36;
            auVar42 = vpcmpgtd_avx2(auVar10,local_1a0);
            auVar41._4_4_ = iVar23;
            auVar41._0_4_ = iVar23;
            auVar41._8_4_ = iVar23;
            auVar41._12_4_ = iVar23;
            auVar41._16_4_ = iVar23;
            auVar41._20_4_ = iVar23;
            auVar41._24_4_ = iVar23;
            auVar41._28_4_ = iVar23;
            auVar11 = vpcmpgtd_avx2(local_180,auVar41);
            auVar42 = vpor_avx2(auVar42,auVar11);
            if ((((((((auVar42 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar42 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar42 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar42 >> 0x7f,0) != '\0') ||
                  (auVar42 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar42 >> 0xbf,0) != '\0') ||
                (auVar42 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar42[0x1f] < '\0') {
              *(byte *)&ppVar15->flag = (byte)ppVar15->flag | 0x40;
              iVar29 = 0;
              iVar26 = 0;
              iVar14 = 0;
            }
            ppVar15->score = iVar29;
            ppVar15->end_query = iVar14;
            ppVar15->end_ref = iVar26;
            parasail_free(ptr_01);
            parasail_free(ptr_00);
            parasail_free(ptr);
            if (matrix->type == 0) {
              parasail_free(local_2f8);
              return ppVar15;
            }
            return ppVar15;
          }
        }
        return (parasail_result_t *)0x0;
      }
      if (_s1 == (char *)0x0) {
        __format = "%s: missing %s\n";
        pcVar18 = "_s1";
      }
      else {
        if (0 < _s1Len) goto LAB_0075830c;
        __format = "%s: %s must be > 0\n";
        pcVar18 = "_s1Len";
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sw_table_diag_avx2_256_32",pcVar18);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int32_t * restrict s1 = NULL;
    int32_t * restrict s2B = NULL;
    int32_t * restrict _H_pr = NULL;
    int32_t * restrict _F_pr = NULL;
    int32_t * restrict s2 = NULL;
    int32_t * restrict H_pr = NULL;
    int32_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInf;
    __m256i vNegInf0;
    __m256i vOpen;
    __m256i vGap;
    __m256i vZero;
    __m256i vOne;
    __m256i vN;
    __m256i vNegOne;
    __m256i vI;
    __m256i vJreset;
    __m256i vMaxH;
    __m256i vEndI;
    __m256i vEndJ;
    __m256i vILimit;
    __m256i vJLimit;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 8; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm256_set1_epi32(NEG_LIMIT);
    vNegInf0 = _mm256_srli_si256_rpl(vNegInf, 4); /* shift in a 0 */
    vOpen = _mm256_set1_epi32(open);
    vGap  = _mm256_set1_epi32(gap);
    vZero = _mm256_set1_epi32(0);
    vOne = _mm256_set1_epi32(1);
    vN = _mm256_set1_epi32(N);
    vNegOne = _mm256_set1_epi32(-1);
    vI = _mm256_set_epi32(0,1,2,3,4,5,6,7);
    vJreset = _mm256_set_epi32(0,-1,-2,-3,-4,-5,-6,-7);
    vMaxH = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm256_set1_epi32(s1Len);
    vJLimit = _mm256_set1_epi32(s2Len);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int32_t(32, s2Len+PAD2);
    _H_pr = parasail_memalign_int32_t(32, s2Len+PAD2);
    _F_pr = parasail_memalign_int32_t(32, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int32_t(32, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m256i vNH = vNegInf0;
        __m256i vWH = vNegInf0;
        __m256i vE = vNegInf;
        __m256i vF = vNegInf;
        __m256i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        __m256i vIltLimit = _mm256_cmplt_epi32_rpl(vI, vILimit);
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m256i vMat;
            __m256i vNWH = vNH;
            vNH = _mm256_srli_si256_rpl(vWH, 4);
            vNH = _mm256_insert_epi32_rpl(vNH, H_pr[j], 7);
            vF = _mm256_srli_si256_rpl(vF, 4);
            vF = _mm256_insert_epi32_rpl(vF, F_pr[j], 7);
            vF = _mm256_max_epi32(
                    _mm256_sub_epi32(vNH, vOpen),
                    _mm256_sub_epi32(vF, vGap));
            vE = _mm256_max_epi32(
                    _mm256_sub_epi32(vWH, vOpen),
                    _mm256_sub_epi32(vE, vGap));
            vMat = _mm256_set_epi32(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]]
                    );
            vNWH = _mm256_add_epi32(vNWH, vMat);
            vWH = _mm256_max_epi32(vNWH, vE);
            vWH = _mm256_max_epi32(vWH, vF);
            vWH = _mm256_max_epi32(vWH, vZero);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m256i cond = _mm256_cmpeq_epi32(vJ,vNegOne);
                vWH = _mm256_andnot_si256(cond, vWH);
                vF = _mm256_blendv_epi8(vF, vNegInf, cond);
                vE = _mm256_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm256_min_epi32(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-7] = (int32_t)_mm256_extract_epi32_rpl(vWH,0);
            F_pr[j-7] = (int32_t)_mm256_extract_epi32_rpl(vF,0);
            /* as minor diagonal vector passes across table, extract
             * max values within the i,j bounds */
            {
                __m256i cond_valid_J = _mm256_and_si256(
                        _mm256_cmpgt_epi32(vJ, vNegOne),
                        _mm256_cmplt_epi32_rpl(vJ, vJLimit));
                __m256i cond_valid_IJ = _mm256_and_si256(cond_valid_J, vIltLimit);
                __m256i cond_eq = _mm256_cmpeq_epi32(vWH, vMaxH);
                __m256i cond_max = _mm256_cmpgt_epi32(vWH, vMaxH);
                __m256i cond_all = _mm256_and_si256(cond_max, cond_valid_IJ);
                __m256i cond_Jlt = _mm256_cmplt_epi32_rpl(vJ, vEndJ);
                vMaxH = _mm256_blendv_epi8(vMaxH, vWH, cond_all);
                vEndI = _mm256_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm256_blendv_epi8(vEndJ, vJ, cond_all);
                cond_all = _mm256_and_si256(cond_Jlt, cond_eq);
                cond_all = _mm256_and_si256(cond_all, cond_valid_IJ);
                vEndI = _mm256_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm256_blendv_epi8(vEndJ, vJ, cond_all);
            }
            vJ = _mm256_add_epi32(vJ, vOne);
        }
        vI = _mm256_add_epi32(vI, vN);
    }

    /* alignment ending position */
    {
        int32_t *t = (int32_t*)&vMaxH;
        int32_t *i = (int32_t*)&vEndI;
        int32_t *j = (int32_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++t, ++i, ++j) {
            if (*t > score) {
                score = *t;
                end_query = *i;
                end_ref = *j;
            }
            else if (*t == score) {
                if (*j < end_ref) {
                    end_query = *i;
                    end_ref = *j;
                }
                else if (*j == end_ref && *i < end_query) {
                    end_query = *i;
                    end_ref = *j;
                }
            }
        }
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi32_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}